

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test1<nrg::AsyncExecutor<nrg::InstantExecution>>(char *title)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  anon_union_4_2_e8b08be2_for__Optional_base<int,_false>_2 aVar4;
  int i;
  Executor<nrg::AsyncExecutor<nrg::InstantExecution>_> ex;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  TimedCaller local_c0;
  AsyncResult<int> ar1;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_88;
  AsyncResult<int> ar2;
  optional<int> res3;
  AsyncResult<int> ar4;
  AsyncResult<int> ar3;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  
  local_48[1] = (code *)0x0;
  local_48[0] = onError;
  local_30 = std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>
             ::_M_invoke;
  local_38 = std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>
             ::_M_manager;
  nrg::Executor<nrg::AsyncExecutor<nrg::InstantExecution>_>::Executor
            (&ex,(ExceptionHandler *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  i = 0x2a;
  ar1.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&std::cerr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0," -> start",(allocator<char> *)&ar2);
  std::operator+(&local_c0.msg_,title,&local_e0);
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<std::__cxx11::string>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&ar1,
             &local_c0.msg_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  i = i + 1;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&i,(char (*) [7])"hallo1");
  i = i + 1;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&i,(char (*) [7])"hallo2");
  i = i + 1;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&i,(char (*) [7])"hallo3");
  i = i + 1;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&i,(char (*) [7])"hallo4");
  i = i + 1;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&i,(char (*) [7])"hallo5");
  i = i + 1;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&i,(char (*) [7])"hallo6");
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,exception);
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  local_c0.msg_._M_dataplus._M_p._0_4_ = 0x2a;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,withResult,&ar1,&ar2,&ar3,(int *)&local_c0);
  iVar1 = nrg::AsyncResult<int>::Impl::getResult
                    (ar1.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_c0.msg_._M_dataplus._M_p = (pointer)0x0;
  iVar2 = nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
                    (&ar2,(duration<long,_std::ratio<1L,_1000L>_> *)&local_c0,0x2b);
  local_c0.msg_._M_dataplus._M_p = (pointer)0x0;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)&res3,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  poVar3 = std::operator<<((ostream *)&std::cerr,"ar1: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,",  ar2: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,",  res3: ");
  aVar4._M_payload = 0;
  if (res3.super__Optional_base<int,_false>._M_engaged != false) {
    aVar4 = res3.super__Optional_base<int,_false>.field_0;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,aVar4._M_payload);
  std::operator<<(poVar3,"\n");
  std::chrono::_V2::steady_clock::now();
  std::make_shared<nrg::AsyncResult<int>::Impl>();
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,roundTrip,&ar4);
  local_c0.msg_._M_dataplus._M_p = (pointer)0xc8;
  nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
            (&ar4,(duration<long,_std::ratio<1L,_1000L>_> *)&local_c0,99);
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"ar4 duration: ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3," ns\n");
  local_c0.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e0._M_dataplus._M_p._0_4_ = 0xfb;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c0,
             (int *)&local_e0);
  local_c0.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e0._M_dataplus._M_p._0_4_ = 0xfc;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c0,
             (int *)&local_e0);
  local_c0.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e0._M_dataplus._M_p._0_4_ = 0xfd;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c0,
             (int *)&local_e0);
  local_c0.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e0._M_dataplus._M_p._0_4_ = 0xfe;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c0,
             (int *)&local_e0);
  local_c0.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e0._M_dataplus._M_p._0_4_ = 0xff;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c0,
             (int *)&local_e0);
  local_c0.msg_._M_dataplus._M_p = (pointer)&std::cerr;
  local_e0._M_dataplus._M_p._0_4_ = 0x100;
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_c0,
             (int *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"no timeout",(allocator<char> *)&local_88);
  TimedCaller::TimedCaller(&local_c0,&local_e0);
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  local_88._M_data = (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0," -> done\n",&local_e1);
  std::operator+(&local_c0.msg_,title,&local_e0);
  nrg::detail::AsyncQueue<nrg::InstantExecution>::operator()
            (ex.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<std::__cxx11::string>,&local_88,&local_c0.msg_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar4.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ar1.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ex.executor_.impl_.
              super___shared_ptr<nrg::detail::AsyncQueue<nrg::InstantExecution>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void test1(const char* title)
{
    nrg::Executor<ExecutionMode> ex(onError);
    int i = 42;
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> start"));
    ex(print2, ++i, "hallo1");
    ex(print2, ++i, "hallo2");
    ex(print2, ++i, "hallo3");
    ex(print2, ++i, "hallo4");
    ex(print2, ++i, "hallo5");
    ex(print2, ++i, "hallo6");

    ex(exception);

    nrg::AsyncResult<int> ar1;
    nrg::AsyncResult<int> ar2;
    nrg::AsyncResult<int> ar3;

    ex(withResult, ar1, ar2, ar3, 42);
    int res1 = ar1.getResult();
    int res2 = ar2.getResult(std::chrono::milliseconds(0), 43);
    std::experimental::optional<int> res3 = ar3.getResult(std::chrono::milliseconds(0));
    std::cerr <<  "ar1: " <<  res1 << ",  ar2: " << res2 << ",  res3: " << (res3 ? *res3 : 0) << "\n";

    auto t1 = now();

    nrg::AsyncResult<int> ar4;
    ex(roundTrip, ar4);
    ar4.getResult(std::chrono::milliseconds(200), 99);
    auto dur = now()-t1;
    std::cout <<  "ar4 duration: " << std::chrono::duration_cast<std::chrono::nanoseconds>(dur).count() << " ns\n";

    ex(print<int>, std::ref(std::cerr), 251);
    ex(print<int>, std::ref(std::cerr), 252);
    ex(print<int>, std::ref(std::cerr), 253);
    ex(print<int>, std::ref(std::cerr), 254);
    ex(print<int>, std::ref(std::cerr), 255);
    ex(print<int>, std::ref(std::cerr), 256);
    ex(TimedCaller("no timeout"));
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> done\n"));

    //std::this_thread::sleep_for(std::chrono::milliseconds(1000));
}